

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  undefined4 in_register_00000084;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_264_17_dd0fa161 f;
  undefined1 local_160 [8];
  void *local_158;
  int *local_150 [2];
  long local_140;
  anon_class_264_17_dd0fa161 local_138;
  
  iVar1 = offset;
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])(local_150,this);
  *(ulong *)local_150[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_150[0] >> 0x20),
                offset + (int)*(undefined8 *)local_150[0]);
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(local_160,this);
  lambda_QGate2<std::complex<double>>
            (&local_138,(qgates *)(ulong)(uint)(int)(char)op,(Op)local_160,
             (SquareMatrix<std::complex<double>_> *)
             (vector->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (complex<double> *)CONCAT44(in_register_00000084,iVar1));
  if (local_158 != (void *)0x0) {
    operator_delete__(local_158);
  }
  local_158 = (void *)0x0;
  apply4<qclab::qgates::lambda_QGate2<std::complex<double>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<double>>,std::complex<double>*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_150[0],local_150[0][1],&local_138);
  if (local_150[0] != (int *)0x0) {
    operator_delete(local_150[0],local_140 - (long)local_150[0]);
  }
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }